

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O0

void putmbi(int i,_func_void_int_void_ptr *putout,void *out)

{
  int local_2c;
  int local_28;
  int accu;
  int l;
  int cnt;
  void *out_local;
  _func_void_int_void_ptr *putout_local;
  int i_local;
  
  accu = 0;
  local_2c = 0;
  while (local_28 = accu, local_2c != i) {
    local_2c = (i & 0x7f << ((char)accu * '\a' & 0x1fU)) + local_2c;
    accu = accu + 1;
  }
  while (local_28 = local_28 + -1, 0 < local_28) {
    (*putout)((i & 0x7f << ((char)local_28 * '\a' & 0x1fU)) >> ((char)local_28 * '\a' & 0x1fU) |
              0x80,out);
  }
  (*putout)(i & 0x7f,out);
  return;
}

Assistant:

void putmbi(int i, void (*putout)(int c, void *out), void *out)
{
	int cnt, l, accu;

	/* Get number of septets */
	accu = cnt = 0;
	while(accu != i) {
		accu += i & 0x7f << 7 * cnt++;
	}

	/* Produce the multibyte output */
	for(l = cnt - 1; l > 0; l--) {
		putout(0x80 | (i & 0x7f << 7 * l) >> 7 * l, out);
	}

	putout(i & 0x7f, out);
}